

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wang_index_impl.h
# Opt level: O3

double __thiscall
json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::jedi
          (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *this
          ,TreeIndexJSON *t1,TreeIndexJSON *t2)

{
  size_type sVar1;
  ulong uVar2;
  Matrix<double> *this_00;
  Matrix<double> *this_01;
  Matrix<double> *this_02;
  Matrix<double> *this_03;
  Matrix<double> *this_04;
  Matrix<double> *this_05;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  int *piVar8;
  bool bVar9;
  double dVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  pointer piVar14;
  ulong uVar15;
  pointer pvVar16;
  ulong uVar17;
  size_t sVar18;
  ulong col;
  uint uVar19;
  int iVar20;
  long lVar21;
  size_t sVar22;
  long lVar23;
  size_type sVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  int iVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double local_118;
  double local_c8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  pointer local_90;
  double local_88;
  undefined8 uStack_80;
  TreeIndexJSON *local_70;
  int local_64;
  long local_60;
  Matrix<double> *local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (this->super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>).
  subproblem_counter_ = 0;
  uVar3 = (t1->super_Constants).tree_size_;
  uVar19 = (t2->super_Constants).tree_size_;
  col = (ulong)uVar19;
  uVar25 = uVar19;
  if (((int)uVar3 < 1) || (uVar25 = uVar3, (int)uVar19 < 1)) {
    return (double)(int)uVar25;
  }
  sVar26 = (size_t)(t1->super_PostLToHeight).postl_to_height_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(ulong)uVar3 - 1];
  sVar1 = (ulong)uVar3 + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->del_t1_subtree_,sVar1);
  std::vector<double,_std::allocator<double>_>::resize(&this->del_f1_subtree_,sVar1);
  sVar1 = col + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->ins_t2_subtree_,sVar1);
  std::vector<double,_std::allocator<double>_>::resize(&this->ins_f2_subtree_,sVar1);
  sVar22 = sVar26 + 1;
  local_50 = sVar26;
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->dt_).rows_ = local_b0._0_8_;
  (this->dt_).columns_ = local_b0._8_8_;
  pdVar4 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->df_).rows_ = local_b0._0_8_;
  (this->df_).columns_ = local_b0._8_8_;
  pdVar4 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->e0_).rows_ = local_b0._0_8_;
  (this->e0_).columns_ = local_b0._8_8_;
  pdVar4 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->e_).rows_ = local_b0._0_8_;
  (this->e_).columns_ = local_b0._8_8_;
  pdVar4 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->del_forest_).rows_ = local_b0._0_8_;
  (this->del_forest_).columns_ = local_b0._8_8_;
  pdVar4 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->del_tree_).rows_ = local_b0._0_8_;
  (this->del_tree_).columns_ = local_b0._8_8_;
  pdVar4 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = ZEXT816(0);
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b0,sVar22,sVar1);
  (this->fav_child_dt_).rows_ = local_b0._0_8_;
  (this->fav_child_dt_).columns_ = local_b0._8_8_;
  pdVar4 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a0._0_8_;
  (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a0._8_8_;
  (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_90;
  local_a0 = (undefined1  [16])0x0;
  local_90 = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,(long)local_90 - local_a0._0_8_);
    }
  }
  auVar45 = _DAT_0010b040;
  auVar46 = _DAT_0010b030;
  pdVar4 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    uVar15 = (long)pdVar5 + (-8 - (long)pdVar4);
    auVar48._8_4_ = (int)uVar15;
    auVar48._0_8_ = uVar15;
    auVar48._12_4_ = (int)(uVar15 >> 0x20);
    auVar33._0_8_ = uVar15 >> 3;
    auVar33._8_8_ = auVar48._8_8_ >> 3;
    uVar17 = 0;
    auVar33 = auVar33 ^ _DAT_0010b040;
    do {
      auVar47._8_4_ = (int)uVar17;
      auVar47._0_8_ = uVar17;
      auVar47._12_4_ = (int)(uVar17 >> 0x20);
      auVar48 = (auVar47 | auVar46) ^ auVar45;
      bVar9 = auVar33._0_4_ < auVar48._0_4_;
      iVar42 = auVar33._4_4_;
      iVar20 = auVar48._4_4_;
      if ((bool)(~(iVar42 < iVar20 || iVar20 == iVar42 && bVar9) & 1)) {
        pdVar4[uVar17] = INFINITY;
      }
      if (iVar42 >= iVar20 && (iVar20 != iVar42 || !bVar9)) {
        pdVar4[uVar17 + 1] = INFINITY;
      }
      uVar17 = uVar17 + 2;
    } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar17);
  }
  auVar45 = _DAT_0010b040;
  auVar46 = _DAT_0010b030;
  pdVar4 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    uVar15 = (long)pdVar5 + (-8 - (long)pdVar4);
    auVar34._8_4_ = (int)uVar15;
    auVar34._0_8_ = uVar15;
    auVar34._12_4_ = (int)(uVar15 >> 0x20);
    auVar35._0_8_ = uVar15 >> 3;
    auVar35._8_8_ = auVar34._8_8_ >> 3;
    uVar17 = 0;
    auVar35 = auVar35 ^ _DAT_0010b040;
    do {
      auVar49._8_4_ = (int)uVar17;
      auVar49._0_8_ = uVar17;
      auVar49._12_4_ = (int)(uVar17 >> 0x20);
      auVar48 = (auVar49 | auVar46) ^ auVar45;
      bVar9 = auVar35._0_4_ < auVar48._0_4_;
      iVar42 = auVar35._4_4_;
      iVar20 = auVar48._4_4_;
      if ((bool)(~(iVar42 < iVar20 || iVar20 == iVar42 && bVar9) & 1)) {
        pdVar4[uVar17] = INFINITY;
      }
      if (iVar42 >= iVar20 && (iVar20 != iVar42 || !bVar9)) {
        pdVar4[uVar17 + 1] = INFINITY;
      }
      uVar17 = uVar17 + 2;
    } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar17);
  }
  pdVar4 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
  }
  pdVar4 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
  }
  auVar45 = _DAT_0010b040;
  auVar46 = _DAT_0010b030;
  pdVar4 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    uVar15 = (long)pdVar5 + (-8 - (long)pdVar4);
    auVar36._8_4_ = (int)uVar15;
    auVar36._0_8_ = uVar15;
    auVar36._12_4_ = (int)(uVar15 >> 0x20);
    auVar37._0_8_ = uVar15 >> 3;
    auVar37._8_8_ = auVar36._8_8_ >> 3;
    uVar17 = 0;
    auVar37 = auVar37 ^ _DAT_0010b040;
    do {
      auVar50._8_4_ = (int)uVar17;
      auVar50._0_8_ = uVar17;
      auVar50._12_4_ = (int)(uVar17 >> 0x20);
      auVar48 = (auVar50 | auVar46) ^ auVar45;
      bVar9 = auVar37._0_4_ < auVar48._0_4_;
      iVar42 = auVar37._4_4_;
      iVar20 = auVar48._4_4_;
      if ((bool)(~(iVar42 < iVar20 || iVar20 == iVar42 && bVar9) & 1)) {
        pdVar4[uVar17] = INFINITY;
      }
      if (iVar42 >= iVar20 && (iVar20 != iVar42 || !bVar9)) {
        pdVar4[uVar17 + 1] = INFINITY;
      }
      uVar17 = uVar17 + 2;
    } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar17);
  }
  auVar45 = _DAT_0010b040;
  auVar46 = _DAT_0010b030;
  pdVar4 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    uVar15 = (long)pdVar5 + (-8 - (long)pdVar4);
    auVar38._8_4_ = (int)uVar15;
    auVar38._0_8_ = uVar15;
    auVar38._12_4_ = (int)(uVar15 >> 0x20);
    auVar39._0_8_ = uVar15 >> 3;
    auVar39._8_8_ = auVar38._8_8_ >> 3;
    uVar17 = 0;
    auVar39 = auVar39 ^ _DAT_0010b040;
    do {
      auVar51._8_4_ = (int)uVar17;
      auVar51._0_8_ = uVar17;
      auVar51._12_4_ = (int)(uVar17 >> 0x20);
      auVar48 = (auVar51 | auVar46) ^ auVar45;
      bVar9 = auVar39._0_4_ < auVar48._0_4_;
      iVar42 = auVar39._4_4_;
      iVar20 = auVar48._4_4_;
      if ((bool)(~(iVar42 < iVar20 || iVar20 == iVar42 && bVar9) & 1)) {
        pdVar4[uVar17] = INFINITY;
      }
      if (iVar42 >= iVar20 && (iVar20 != iVar42 || !bVar9)) {
        pdVar4[uVar17 + 1] = INFINITY;
      }
      uVar17 = uVar17 + 2;
    } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar17);
  }
  auVar45 = _DAT_0010b040;
  auVar46 = _DAT_0010b030;
  pdVar4 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    uVar15 = (long)pdVar5 + (-8 - (long)pdVar4);
    auVar40._8_4_ = (int)uVar15;
    auVar40._0_8_ = uVar15;
    auVar40._12_4_ = (int)(uVar15 >> 0x20);
    auVar41._0_8_ = uVar15 >> 3;
    auVar41._8_8_ = auVar40._8_8_ >> 3;
    uVar17 = 0;
    auVar41 = auVar41 ^ _DAT_0010b040;
    do {
      auVar52._8_4_ = (int)uVar17;
      auVar52._0_8_ = uVar17;
      auVar52._12_4_ = (int)(uVar17 >> 0x20);
      auVar48 = (auVar52 | auVar46) ^ auVar45;
      bVar9 = auVar41._0_4_ < auVar48._0_4_;
      iVar42 = auVar41._4_4_;
      iVar20 = auVar48._4_4_;
      if ((bool)(~(iVar42 < iVar20 || iVar20 == iVar42 && bVar9) & 1)) {
        pdVar4[uVar17] = INFINITY;
      }
      if (iVar42 >= iVar20 && (iVar20 != iVar42 || !bVar9)) {
        pdVar4[uVar17 + 1] = INFINITY;
      }
      uVar17 = uVar17 + 2;
    } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar17);
  }
  pdVar4 = (this->del_t1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->del_t1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar15 = (long)pdVar5 - (long)pdVar4 >> 3;
  if (pdVar5 != pdVar4) {
    *pdVar4 = 0.0;
    pdVar5 = (this->del_f1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->del_f1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar11 = (long)pdVar6 - (long)pdVar5 >> 3;
    if (pdVar6 != pdVar5) {
      this_00 = &this->dt_;
      this_01 = &this->df_;
      this_02 = &this->e0_;
      this_03 = &this->e_;
      this_04 = &this->del_forest_;
      this_05 = &this->del_tree_;
      local_58 = &this->fav_child_dt_;
      *pdVar5 = 0.0;
      pvVar16 = (t1->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = 1;
      do {
        if (uVar17 == lVar11 + (ulong)(lVar11 == 0)) goto LAB_001051c4;
        pdVar5[uVar17] = 0.0;
        lVar23 = *(long *)&pvVar16[uVar17 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl
        ;
        dVar43 = 1.0;
        lVar29 = (long)*(pointer *)
                        ((long)&pvVar16[uVar17 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar23;
        if (lVar29 != 0) {
          dVar43 = 0.0;
          uVar25 = 2;
          do {
            lVar21 = (long)*(int *)(lVar23 + (ulong)(uVar25 - 2) * 4);
            if (uVar15 <= lVar21 + 1U) goto LAB_001051c4;
            dVar43 = dVar43 + pdVar4[lVar21 + 1];
            pdVar5[uVar17] = dVar43;
            uVar27 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar27 <= (ulong)(lVar29 >> 2));
          dVar43 = dVar43 + 1.0;
        }
        if (uVar17 == uVar15 + (uVar15 == 0)) goto LAB_001051c4;
        pdVar4[uVar17] = dVar43;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar3 + 1);
      pdVar4 = (this->ins_t2_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar4 = 0.0;
      pdVar5 = (this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar5 = 0.0;
      lVar11 = (long)(this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(this->ins_t2_subtree_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
      sVar24 = 1;
      while (sVar24 != lVar11 + (ulong)(lVar11 == 0)) {
        pdVar5[sVar24] = 0.0;
        lVar23 = *(long *)&pvVar16[sVar24 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl
        ;
        dVar43 = 1.0;
        lVar29 = (long)*(pointer *)
                        ((long)&pvVar16[sVar24 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar23;
        if (lVar29 != 0) {
          dVar43 = 0.0;
          uVar25 = 2;
          do {
            lVar21 = (long)*(int *)(lVar23 + (ulong)(uVar25 - 2) * 4);
            if (uVar15 <= lVar21 + 1U) goto LAB_001051c4;
            dVar43 = dVar43 + pdVar4[lVar21 + 1];
            pdVar5[sVar24] = dVar43;
            uVar17 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar17 <= (ulong)(lVar29 >> 2));
          dVar43 = dVar43 + 1.0;
        }
        if (sVar24 == uVar15 + (uVar15 == 0)) break;
        pdVar4[sVar24] = dVar43;
        sVar24 = sVar24 + 1;
        if (sVar24 == sVar1) {
          local_38 = (ulong)(uVar19 + 1);
          local_48 = (ulong)(uVar3 + 1);
          uVar15 = 1;
          local_70 = t1;
          do {
            iVar42 = (t1->super_PostLToFavorableChildOrder).postl_to_favorder_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar15 - 1];
            lVar11 = (long)iVar42;
            uVar17 = lVar11 + 1;
            local_60 = lVar11 * 3;
            uVar27 = 1;
            local_40 = uVar15;
            do {
              pvVar16 = (t1->super_PostLToChildren).postl_to_children_.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                           + local_60 * 8 + 8) ==
                  *(long *)((long)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                           + local_60 * 8)) {
                local_88 = INFINITY;
                local_c8 = INFINITY;
              }
              else {
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar11],
                                     uVar27 - 1);
                local_c8 = *pdVar12;
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar11],
                                     uVar27 - 1);
                local_88 = *pdVar12;
              }
              sVar22 = uVar27 - 1;
              uStack_80 = 0;
              pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar14 = *(pointer *)
                         &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
              auVar46 = _DAT_0010b050;
              if (*(pointer *)
                   ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                   ) != piVar14) {
                uVar19 = 1;
                uVar15 = 0;
                auVar45 = _DAT_0010b050;
                do {
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],(long)piVar14[uVar15] + 1);
                  lVar23 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_.
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4);
                  uVar28 = lVar23 + 1;
                  pdVar4 = (this->ins_f2_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->ins_f2_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar28
                     ) goto LAB_001051c4;
                  dVar43 = *pdVar12;
                  dVar30 = pdVar4[lVar23 + 1];
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],uVar28);
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  pdVar4 = (this->ins_t2_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->ins_t2_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                      (long)piVar14[uVar15] + 1U) goto LAB_001051c4;
                  auVar44._0_8_ = dVar43 - dVar30;
                  auVar44._8_8_ = *pdVar12 - pdVar4[(long)piVar14[uVar15] + 1];
                  auVar45 = minpd(auVar44,auVar45);
                  uVar15 = (ulong)uVar19;
                  uVar19 = uVar19 + 1;
                } while (uVar15 < (ulong)((long)*(pointer *)
                                                 ((long)&pvVar16[sVar22].
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                pdVar4 = (this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((ulong)((long)(this->ins_f2_subtree_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar27)
                   || (pdVar5 = (this->ins_t2_subtree_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                      (ulong)((long)(this->ins_t2_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar27
                      )) goto LAB_001051c4;
                auVar46._0_8_ = auVar45._0_8_ + pdVar4[uVar27];
                auVar46._8_8_ = auVar45._8_8_ + pdVar5[uVar27];
              }
              pvVar7 = (t1->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_60 * 8 + 8) ==
                  *(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_60 * 8)) {
                pdVar4 = (this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->ins_f2_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar27)
                goto LAB_001051c4;
                dVar43 = pdVar4[uVar27];
LAB_001042d2:
                dVar43 = dVar43 + 0.0;
              }
              else {
                piVar14 = *(pointer *)
                           ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8);
                if (piVar14 ==
                    *(pointer *)
                     &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
                  pdVar4 = (this->del_f1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if (uVar17 < (ulong)((long)(this->del_f1_subtree_).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)pdVar4 >> 3)) {
                    dVar43 = pdVar4[lVar11 + 1];
                    goto LAB_001042d2;
                  }
                  goto LAB_001051c4;
                }
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_03,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar11],
                                     (long)piVar14[-1] + 1);
                dVar43 = *pdVar12;
              }
              uVar15 = -(ulong)(auVar46._0_8_ <= local_c8);
              dVar30 = (double)(~uVar15 & (ulong)local_c8 | uVar15 & (ulong)auVar46._0_8_);
              uVar15 = -(ulong)(dVar43 <= dVar30);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar11],
                                   uVar27);
              *pdVar12 = (double)(uVar15 & (ulong)dVar43 | ~uVar15 & (ulong)dVar30);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar11],
                                   uVar27);
              dVar43 = *pdVar12;
              dVar30 = cost_model::UnitCostModelJSON<label::JSONLabel>::ren
                                 ((this->
                                  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                                  ).c_,(t1->super_PostLToLabelId).postl_to_label_id_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar11],
                                  (t2->super_PostLToLabelId).postl_to_label_id_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[sVar22]);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar11],
                                   uVar27);
              uVar15 = -(ulong)(auVar46._8_8_ <= local_88);
              dVar32 = (double)(~uVar15 & (ulong)local_88 | (ulong)auVar46._8_8_ & uVar15);
              uVar15 = -(ulong)(dVar30 + dVar43 <= dVar32);
              *pdVar12 = (double)(~uVar15 & (ulong)dVar32 | (ulong)(dVar30 + dVar43) & uVar15);
              if ((uint)uVar17 != uVar3) {
                iVar20 = (t1->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
                piVar14 = (t1->super_PostLToHeight).postl_to_height_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                sVar26 = (size_t)piVar14[iVar20];
                if ((t1->super_PostLToFavChild).postl_to_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar20] == iVar42) {
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_00,(long)piVar14[lVar11],uVar27);
                  dVar43 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(local_58,sVar26,uVar27);
                  *pdVar12 = dVar43;
                  lVar23 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar11];
                  pdVar4 = (this->del_f1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_f1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                      lVar23 + 1U) goto LAB_001051c4;
                  dVar43 = pdVar4[lVar23 + 1];
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],uVar27);
                  pdVar4 = (this->del_f1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_f1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar17
                     ) goto LAB_001051c4;
                  dVar30 = *pdVar12;
                  dVar32 = pdVar4[lVar11 + 1];
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar26,sVar22);
                  *pdVar12 = (dVar43 + dVar30) - dVar32;
                  lVar23 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar11];
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                      lVar23 + 1U) goto LAB_001051c4;
                  dVar43 = pdVar4[lVar23 + 1];
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],uVar27);
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar17
                     ) goto LAB_001051c4;
                  dVar30 = *pdVar12;
                  dVar32 = pdVar4[lVar11 + 1];
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar26,sVar22);
                  *pdVar12 = (dVar43 + dVar30) - dVar32;
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  *pdVar12 = 0.0;
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar19 = 1;
                    uVar15 = 0;
                    do {
                      if (uVar19 == 1) {
                        sVar18 = 0;
                      }
                      else {
                        sVar18 = (long)piVar14[uVar19 - 2] + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,sVar18);
                      sVar18 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                        postl_to_children_.
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4) + 1;
                      pdVar4 = (this->ins_t2_subtree_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      if ((ulong)((long)(this->ins_t2_subtree_).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                          sVar18) goto LAB_001051c4;
                      dVar43 = *pdVar12;
                      dVar30 = pdVar4[sVar18];
                      pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,sVar18);
                      *pdVar12 = dVar43 + dVar30;
                      uVar15 = (ulong)uVar19;
                      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar19 = uVar19 + 1;
                    } while (uVar15 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar16[sVar22].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                }
                pvVar16 = (t1->super_PostLToChildren).postl_to_children_.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar20 = (t1->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
                piVar8 = *(int **)&pvVar16[iVar20].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl;
                if (((*(pointer *)
                       ((long)&pvVar16[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar8) && (*piVar8 == iVar42)) ||
                   ((t1->super_PostLToFavChild).postl_to_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar20] != iVar42)) {
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar26,sVar22);
                  lVar23 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar11];
                  pdVar4 = (this->del_f1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_f1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                      lVar23 + 1U) goto LAB_001051c4;
                  dVar43 = pdVar4[lVar23 + 1];
                  pdVar13 = data_structures::Matrix<double>::at
                                      (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],uVar27);
                  pdVar4 = (this->del_f1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_f1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar17
                     ) goto LAB_001051c4;
                  dVar43 = (dVar43 + *pdVar13) - pdVar4[lVar11 + 1];
                  if (*pdVar12 <= dVar43) {
                    dVar43 = *pdVar12;
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar26,sVar22);
                  *pdVar12 = dVar43;
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar26,sVar22);
                  lVar23 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar11];
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                      lVar23 + 1U) goto LAB_001051c4;
                  dVar43 = pdVar4[lVar23 + 1];
                  pdVar13 = data_structures::Matrix<double>::at
                                      (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar11],uVar27);
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar17
                     ) goto LAB_001051c4;
                  dVar43 = (dVar43 + *pdVar13) - pdVar4[lVar11 + 1];
                  if (*pdVar12 <= dVar43) {
                    dVar43 = *pdVar12;
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar26,sVar22);
                  *pdVar12 = dVar43;
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  dVar43 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                  *pdVar12 = dVar43;
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar19 = 1;
                    uVar15 = 0;
                    do {
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar26,(long)piVar14[uVar15] + 1);
                      dVar43 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_02,sVar26,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4) + 1);
                      *pdVar12 = dVar43;
                      uVar15 = (ulong)uVar19;
                      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar19 = uVar19 + 1;
                    } while (uVar15 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar16[sVar22].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar17
                     ) goto LAB_001051c4;
                  dVar43 = *pdVar12;
                  dVar30 = pdVar4[lVar11 + 1];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  *pdVar12 = dVar43 + dVar30;
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    dVar43 = 4.94065645841247e-324;
                    dVar30 = 0.0;
                    do {
                      dVar32 = dVar43;
                      iVar20 = SUB84(dVar32,0);
                      local_88 = dVar30;
                      if (iVar20 == 1) {
                        pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                        lVar23 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (long)dVar30 * 4);
                        uVar15 = lVar23 + 1;
                        pdVar4 = (this->ins_t2_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->ins_t2_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar15) goto LAB_001051c4;
                        dVar43 = *pdVar12;
                        dVar30 = pdVar4[lVar23 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,uVar15);
                        pdVar4 = (this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->del_t1_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar17) goto LAB_001051c4;
                        dVar43 = dVar43 + dVar30;
                        local_118 = *pdVar12 + pdVar4[lVar11 + 1];
                        sVar18 = 0;
                      }
                      else {
                        pdVar12 = data_structures::Matrix<double>::at
                                            (this_03,sVar26,(long)piVar14[iVar20 - 2] + 1);
                        lVar23 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (long)dVar30 * 4);
                        uVar15 = lVar23 + 1;
                        pdVar4 = (this->ins_t2_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->ins_t2_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar15) goto LAB_001051c4;
                        dVar43 = *pdVar12;
                        dVar30 = pdVar4[lVar23 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,uVar15);
                        pdVar4 = (this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->del_t1_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar17) goto LAB_001051c4;
                        dVar43 = dVar43 + dVar30;
                        local_118 = *pdVar12 + pdVar4[lVar11 + 1];
                        sVar18 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(iVar20 - 2) * 4) + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,sVar18);
                      dVar10 = local_88;
                      dVar30 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_00,(long)(local_70->super_PostLToHeight).
                                                         postl_to_height_.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar11],
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (long)local_88 * 4) + 1);
                      dVar31 = dVar30 + *pdVar12;
                      if (local_118 <= dVar30 + *pdVar12) {
                        dVar31 = local_118;
                      }
                      if (dVar43 <= dVar31) {
                        dVar31 = dVar43;
                      }
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar26,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (long)dVar10 * 4) + 1);
                      *pdVar12 = dVar31;
                      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      dVar43 = (double)(ulong)(iVar20 + 1);
                      dVar30 = dVar32;
                    } while ((ulong)dVar32 <
                             (ulong)((long)*(pointer *)
                                            ((long)&pvVar16[sVar22].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  t1 = local_70;
                  if (uVar27 != col) {
                    pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                    dVar43 = *pdVar12;
                    pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                    *pdVar12 = dVar43;
                  }
                }
                iVar20 = (t1->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
                if ((t1->super_PostLToFavChild).postl_to_left_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar20] == iVar42) {
                  lVar23 = (long)(t1->super_PostLToFavChild).postl_to_fav_child_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar20];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  local_64 = (int)*pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  dVar43 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                  *pdVar12 = dVar43;
                  if (uVar27 != col) {
                    pdVar4 = (this->del_t1_subtree_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((ulong)((long)(this->del_t1_subtree_).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <=
                        uVar17) goto LAB_001051c4;
                    dVar43 = pdVar4[lVar11 + 1];
                    pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                    *pdVar12 = dVar43 + *pdVar12;
                  }
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar19 = 1;
                    uVar15 = 0;
                    do {
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar26,(long)piVar14[uVar15] + 1);
                      dVar43 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_02,sVar26,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4) + 1);
                      *pdVar12 = dVar43;
                      uVar15 = (ulong)uVar19;
                      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar19 = uVar19 + 1;
                    } while (uVar15 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar16[sVar22].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  uVar15 = lVar23 + 1;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,0);
                  pdVar4 = (this->del_t1_subtree_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->del_t1_subtree_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar15
                     ) goto LAB_001051c4;
                  dVar43 = *pdVar12;
                  dVar30 = pdVar4[lVar23 + 1];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                  *pdVar12 = dVar43 + dVar30;
                  pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar19 = 1;
                    uVar28 = 0;
                    do {
                      if (uVar19 == 1) {
                        pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                        lVar29 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4);
                        uVar2 = lVar29 + 1;
                        pdVar4 = (this->ins_t2_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->ins_t2_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar2) goto LAB_001051c4;
                        dVar43 = *pdVar12;
                        dVar30 = pdVar4[lVar29 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,uVar2);
                        pdVar4 = (this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->del_t1_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar15) goto LAB_001051c4;
                        dVar43 = dVar43 + dVar30;
                        local_88 = *pdVar12 + pdVar4[lVar23 + 1];
                        sVar18 = 0;
                      }
                      else {
                        pdVar12 = data_structures::Matrix<double>::at
                                            (this_03,sVar26,(long)piVar14[uVar19 - 2] + 1);
                        lVar29 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4);
                        uVar2 = lVar29 + 1;
                        pdVar4 = (this->ins_t2_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->ins_t2_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar2) goto LAB_001051c4;
                        dVar43 = *pdVar12;
                        dVar30 = pdVar4[lVar29 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,uVar2);
                        pdVar4 = (this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        if ((ulong)((long)(this->del_t1_subtree_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                   >> 3) <= uVar15) goto LAB_001051c4;
                        dVar43 = dVar43 + dVar30;
                        local_88 = *pdVar12 + pdVar4[lVar23 + 1];
                        sVar18 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar19 - 2) * 4) + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_02,sVar26,sVar18);
                      dVar30 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (local_58,sVar26,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4) + 1);
                      dVar32 = dVar30 + *pdVar12;
                      if (local_88 <= dVar30 + *pdVar12) {
                        dVar32 = local_88;
                      }
                      if (dVar43 <= dVar32) {
                        dVar32 = dVar43;
                      }
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar26,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4) + 1);
                      *pdVar12 = dVar32;
                      uVar28 = (ulong)uVar19;
                      pvVar16 = (t2->super_PostLToChildren).postl_to_children_.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar16[sVar22].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar19 = uVar19 + 1;
                      t1 = local_70;
                    } while (uVar28 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar16[sVar22].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  if (uVar27 != col) {
                    dVar43 = (double)local_64;
                    pdVar12 = data_structures::Matrix<double>::at(this_03,sVar26,0);
                    *pdVar12 = dVar43;
                  }
                }
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_38);
            uVar15 = local_40 + 1;
            if (uVar15 == local_48) {
              pdVar12 = data_structures::Matrix<double>::at(this_00,local_50,col);
              return *pdVar12;
            }
          } while( true );
        }
      }
    }
  }
LAB_001051c4:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  } while( true );
}

Assistant:

double WangTreeIndex<CostModel, TreeIndex>::jedi(const TreeIndex& t1, 
    const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  // Stop if one of the trees is empty.
  if (t1_input_size < 1) {
    return t2_input_size;
  } else if (t2_input_size < 1) {
    return t1_input_size;
  }
  int t1_height = t1.postl_to_height_[t1_input_size-1];

  // Create cost matrices.
  del_t1_subtree_.resize(t1_input_size+1);
  del_f1_subtree_.resize(t1_input_size+1);
  ins_t2_subtree_.resize(t2_input_size+1);
  ins_f2_subtree_.resize(t2_input_size+1);
  dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e0_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_forest_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_tree_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  fav_child_dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e0_.fill_with(0);
  e_.fill_with(0);
  del_forest_.fill_with(std::numeric_limits<double>::infinity());
  del_tree_.fill_with(std::numeric_limits<double>::infinity());
  fav_child_dt_.fill_with(std::numeric_limits<double>::infinity());

  // Initialize cost matrices.
  del_t1_subtree_.at(0) = 0;
  del_f1_subtree_.at(0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    del_f1_subtree_.at(i) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      del_f1_subtree_.at(i) += del_t1_subtree_.at(t1.postl_to_children_[i-1][k-1] + 1);
    }
    del_t1_subtree_.at(i) = del_f1_subtree_.at(i) + c_.del(t1.postl_to_label_id_[i - 1]);
  }

  ins_t2_subtree_[0] = 0;
  ins_f2_subtree_[0] = 0;
  for (int j = 1; j <= t2_input_size; ++j) {
    ins_f2_subtree_.at(j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      ins_f2_subtree_.at(j) += ins_t2_subtree_.at(t2.postl_to_children_[j-1][k-1] + 1);
    }
    ins_t2_subtree_.at(j) = ins_f2_subtree_.at(j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  double min_for_ins = std::numeric_limits<double>::infinity();
  double min_tree_ins = std::numeric_limits<double>::infinity();
  double min_for_del = std::numeric_limits<double>::infinity();
  double min_tree_del = std::numeric_limits<double>::infinity();
  double min_for_ren = std::numeric_limits<double>::infinity();
  double min_tree_ren = std::numeric_limits<double>::infinity();
  int i = 0;
  
  for (int x = 1; x <= t1_input_size; ++x) {
    // Get postorder number from favorable child order number.
    i = t1.postl_to_favorder_[x-1] + 1;
    // std::cout << "i: " << i << "\t";
    for (int j = 1; j <= t2_input_size; ++j) {
      // std::cout << "i: " << i << ", j: " << j << std::endl;
      // Cost for deletion.
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_del = std::numeric_limits<double>::infinity(); //ins_f2_subtree_.at(j);
        min_tree_del = std::numeric_limits<double>::infinity(); //ins_t2_subtree_.at(j);
      } else {
        // t1[i] is no leaf node. Therefore, read the previously computed value.
        min_for_del = del_forest_.at(t1.postl_to_height_[i-1], j-1);
        min_tree_del = del_tree_.at(t1.postl_to_height_[i-1], j-1);
      }

      // Cost for insertion.
      if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_ins = std::numeric_limits<double>::infinity(); //del_f1_subtree_.at(i);
        min_tree_ins = std::numeric_limits<double>::infinity(); //del_t1_subtree_.at(i);
      } else {
        // t2[j] is no leaf node. Therefore, computed the value.
        min_for_ins = std::numeric_limits<double>::infinity();
        min_tree_ins = std::numeric_limits<double>::infinity();
        for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
          min_for_ins = std::min(min_for_ins,
              (df_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_f2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
          min_tree_ins = std::min(min_tree_ins,
              (dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_t2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
        }
        min_for_ins += ins_f2_subtree_.at(j);
        min_tree_ins += ins_t2_subtree_.at(j);
      }

      // Cost for rename.
      min_for_ren = 0;
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        min_for_ren += ins_f2_subtree_.at(j);
      } else if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be deleted.
        min_for_ren += del_f1_subtree_.at(i);
      } else {
        min_for_ren = e_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t2.postl_to_children_[j-1].size()-1]+1);
      }
      // Fill forest distance matrix.
      df_.at(t1.postl_to_height_[i-1], j) = min_for_del >= min_for_ins ? min_for_ins >= min_for_ren ? min_for_ren : min_for_ins : min_for_del >= min_for_ren ? min_for_ren : min_for_del;
      // Compute tree rename based on forest cost matrix.
      min_tree_ren = df_.at(t1.postl_to_height_[i-1], j) + c_.ren(t1.postl_to_label_id_[i-1], t2.postl_to_label_id_[j-1]);

      // Fill tree distance matrix.
      dt_.at(t1.postl_to_height_[i-1], j) = min_tree_del >= min_tree_ins ? min_tree_ins >= min_tree_ren ? min_tree_ren : min_tree_ins : min_tree_del >= min_tree_ren ? min_tree_ren : min_tree_del;

      // Do not compute for the parent of the root node in T1.
      if (i != t1_input_size)
      {
        int p_i = t1.postl_to_height_[t1.postl_to_parent_[i-1]];
        // Case 1: i is favorable child of parent.
        if (t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          fav_child_dt_.at(p_i, j) = dt_.at(t1.postl_to_height_[i-1], j);
          del_forest_.at(p_i, j-1) = del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i);
          del_tree_.at  (p_i, j-1) = del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i);
          e_.at(p_i, 0) = 0;
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, 0) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            }
          }
        }
        // Case 2: i is either leftmost child (and favorable) OR not favorable child.
        if ((t1.postl_to_children_[t1.postl_to_parent_[i-1]].size() > 0 && 
            t1.postl_to_children_[t1.postl_to_parent_[i-1]][0] == i-1) ||
            t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] != i-1) {
          del_forest_.at(p_i, j-1) = std::min(del_forest_.at(p_i, j-1), del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i));
          del_tree_.at(p_i, j-1) = std::min(del_tree_.at(p_i, j-1), del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i));
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(i);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, 0)                                 + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = e0_.at(p_i, 0);
          }
        }
        // Case 3: t[i] is the left sibling of the favorable child.
        if (t1.postl_to_left_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          int fav_child_postid = t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]]+1;
          // Store initial value of first column in edit distance cost matrix.
          // It is needed for the next j. Therefore rewrite at the end.
          int old_val = e_.at(p_i, 0);
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          if (j != t2_input_size) {
            e0_.at(p_i, 0) += del_t1_subtree_.at(i);
          }
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(fav_child_postid);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, 0)                                 + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = old_val;
          }
        }
      }
    }
  }

  return dt_.at(t1_height, t2_input_size);
}